

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O0

void test_common<long>(uint length,long value)

{
  int iVar1;
  long *plVar2;
  element_type *peVar3;
  undefined8 *puVar4;
  uint local_89c;
  uint local_898;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  long *b;
  long *a;
  undefined1 local_868 [8];
  shared_ptr<long> pb;
  shared_ptr<long> pa;
  long value_local;
  long lStack_838;
  uint length_local;
  long lStack_830;
  uint local_824;
  element_type *local_820;
  long local_818;
  int local_80c;
  element_type *local_808;
  undefined1 *local_800;
  long local_7f8;
  long lStack_7f0;
  long local_7e8;
  long lStack_7e0;
  long local_7d8;
  long lStack_7d0;
  long local_7c8;
  long lStack_7c0;
  long local_7b8;
  long lStack_7b0;
  long local_7a8;
  long lStack_7a0;
  long local_798;
  long lStack_790;
  long local_788;
  long lStack_780;
  element_type *local_770;
  long local_768;
  long lStack_760;
  element_type *local_750;
  long local_748;
  long lStack_740;
  element_type *local_730;
  long local_728;
  long lStack_720;
  element_type *local_710;
  long local_708;
  long lStack_700;
  element_type *local_6f0;
  long local_6e8;
  long lStack_6e0;
  element_type *local_6d0;
  long local_6c8;
  long lStack_6c0;
  element_type *local_6b0;
  long local_6a8;
  long lStack_6a0;
  element_type *local_690;
  long local_688;
  long lStack_680;
  element_type *local_670;
  long local_668;
  long lStack_660;
  element_type *local_650;
  long local_648;
  long lStack_640;
  element_type *local_630;
  long local_628;
  long lStack_620;
  element_type *local_610;
  long local_608;
  long lStack_600;
  element_type *local_5f0;
  long local_5e8;
  long lStack_5e0;
  element_type *local_5d8;
  long local_5d0;
  long local_5c8;
  long lStack_5c0;
  long local_5b8;
  long local_5b0;
  uint local_5a4;
  element_type *local_5a0;
  element_type *local_598;
  int local_58c;
  element_type *local_588;
  element_type *local_580;
  element_type local_578;
  element_type eStack_570;
  element_type local_568;
  element_type eStack_560;
  element_type local_558;
  element_type eStack_550;
  element_type local_548;
  element_type eStack_540;
  element_type local_538;
  element_type eStack_530;
  element_type local_528;
  element_type eStack_520;
  element_type local_518;
  element_type eStack_510;
  element_type local_508;
  element_type eStack_500;
  element_type *local_4f0;
  element_type local_4e8;
  element_type eStack_4e0;
  element_type *local_4d0;
  element_type local_4c8;
  element_type eStack_4c0;
  element_type *local_4b0;
  element_type local_4a8;
  element_type eStack_4a0;
  element_type *local_490;
  element_type local_488;
  element_type eStack_480;
  element_type *local_470;
  element_type local_468;
  element_type eStack_460;
  element_type *local_450;
  element_type local_448;
  element_type eStack_440;
  element_type *local_430;
  element_type local_428;
  element_type eStack_420;
  element_type *local_410;
  element_type local_408;
  element_type eStack_400;
  element_type *local_3f0;
  element_type local_3e8;
  element_type eStack_3e0;
  element_type *local_3d0;
  element_type local_3c8;
  element_type eStack_3c0;
  element_type *local_3b0;
  element_type local_3a8;
  element_type eStack_3a0;
  element_type *local_390;
  element_type local_388;
  element_type eStack_380;
  element_type *local_370;
  element_type local_368;
  element_type eStack_360;
  element_type *local_350;
  element_type *local_348;
  element_type *local_340;
  element_type *local_338;
  element_type *local_330;
  element_type *local_328;
  element_type *local_320;
  element_type *local_318;
  element_type *local_310;
  element_type *local_308;
  element_type *local_300;
  element_type *local_2f8;
  element_type *local_2f0;
  element_type *local_2e8;
  element_type *local_2e0;
  uint local_2d4;
  element_type *local_2d0;
  element_type *local_2c8;
  int local_2bc;
  element_type *local_2b8;
  element_type *local_2b0;
  element_type local_2a8;
  element_type eStack_2a0;
  element_type local_298;
  element_type eStack_290;
  element_type local_288;
  element_type eStack_280;
  element_type local_278;
  element_type eStack_270;
  element_type local_268;
  element_type eStack_260;
  element_type local_258;
  element_type eStack_250;
  element_type local_248;
  element_type eStack_240;
  element_type local_238;
  element_type eStack_230;
  element_type *local_220;
  element_type local_218;
  element_type eStack_210;
  element_type *local_200;
  element_type local_1f8;
  element_type eStack_1f0;
  element_type *local_1e0;
  element_type local_1d8;
  element_type eStack_1d0;
  element_type *local_1c0;
  element_type local_1b8;
  element_type eStack_1b0;
  element_type *local_1a0;
  element_type local_198;
  element_type eStack_190;
  element_type *local_180;
  element_type local_178;
  element_type eStack_170;
  element_type *local_160;
  element_type local_158;
  element_type eStack_150;
  element_type *local_140;
  element_type local_138;
  element_type eStack_130;
  element_type *local_120;
  element_type local_118;
  element_type eStack_110;
  element_type *local_100;
  element_type local_f8;
  element_type eStack_f0;
  element_type *local_e0;
  element_type local_d8;
  element_type eStack_d0;
  element_type *local_c0;
  element_type local_b8;
  element_type eStack_b0;
  element_type *local_a0;
  element_type local_98;
  element_type eStack_90;
  element_type *local_80;
  element_type *local_78;
  element_type *local_70;
  element_type *local_68;
  element_type *local_60;
  element_type *local_58;
  element_type *local_50;
  element_type *local_48;
  element_type *local_40;
  element_type *local_38;
  element_type *local_30;
  element_type *local_28;
  element_type *local_20;
  element_type *local_18;
  element_type *local_10;
  
  plVar2 = nosimd::common::malloc<long>(length + 1);
  std::shared_ptr<long>::shared_ptr<long,void(*)(long*),void>
            ((shared_ptr<long> *)
             &pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount,plVar2,
             nosimd::common::free<long>);
  plVar2 = nosimd::common::malloc<long>(length + 1);
  std::shared_ptr<long>::shared_ptr<long,void(*)(long*),void>
            ((shared_ptr<long> *)local_868,plVar2,nosimd::common::free<long>);
  peVar3 = std::__shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<long,_(__gnu_cxx::_Lock_policy)2> *)
                      &pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_5a0 = std::__shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<long,_(__gnu_cxx::_Lock_policy)2> *)local_868);
  peVar3[length] = 0x7f;
  local_5a0[length] = 0x3f;
  local_800 = (undefined1 *)&stack0xfffffffffffff7c8;
  iVar1 = (int)length >> 1;
  local_808 = peVar3;
  for (local_80c = iVar1; 3 < local_80c; local_80c = local_80c + -4) {
    local_710 = local_808;
    local_630 = local_808;
    *local_808 = value;
    local_808[1] = value;
    local_730 = local_808 + 2;
    *local_730 = value;
    local_808[3] = value;
    local_750 = local_808 + 4;
    *local_750 = value;
    local_808[5] = value;
    local_770 = local_808 + 6;
    *local_770 = value;
    local_808[7] = value;
    local_808 = local_808 + 8;
    local_7f8 = value;
    lStack_7f0 = value;
    local_7e8 = value;
    lStack_7e0 = value;
    local_7d8 = value;
    lStack_7d0 = value;
    local_7c8 = value;
    lStack_7c0 = value;
    local_788 = value;
    lStack_780 = value;
    local_768 = value;
    lStack_760 = value;
    local_748 = value;
    lStack_740 = value;
    local_728 = value;
    lStack_720 = value;
    local_648 = value;
    lStack_640 = value;
    local_628 = value;
    lStack_620 = value;
    local_610 = local_730;
    local_608 = value;
    lStack_600 = value;
    local_5f0 = local_750;
    local_5e8 = value;
    lStack_5e0 = value;
    local_5d8 = local_770;
  }
  if (1 < local_80c) {
    local_6d0 = local_808;
    local_670 = local_808;
    *local_808 = value;
    local_808[1] = value;
    local_6f0 = local_808 + 2;
    *local_6f0 = value;
    local_808[3] = value;
    local_80c = local_80c + -2;
    local_808 = local_808 + 4;
    local_7b8 = value;
    lStack_7b0 = value;
    local_7a8 = value;
    lStack_7a0 = value;
    local_708 = value;
    lStack_700 = value;
    local_6e8 = value;
    lStack_6e0 = value;
    local_688 = value;
    lStack_680 = value;
    local_668 = value;
    lStack_660 = value;
    local_650 = local_6f0;
  }
  if (local_80c != 0) {
    local_6b0 = local_808;
    local_690 = local_808;
    *local_808 = value;
    local_808[1] = value;
    local_798 = value;
    lStack_790 = value;
    local_6c8 = value;
    lStack_6c0 = value;
    local_6a8 = value;
    lStack_6a0 = value;
  }
  if (length != 0) {
    peVar3[(int)(length - 1)] = value;
  }
  for (i_2 = 0; local_2bc = iVar1, local_2b8 = local_5a0, local_2b0 = peVar3, lStack_838 = value,
      lStack_830 = value, local_824 = length, local_820 = peVar3, local_818 = value,
      local_5d0 = value, local_5c8 = value, lStack_5c0 = value, local_5b8 = value, local_5b0 = value
      , i_2 < length; i_2 = i_2 + 1) {
    if (peVar3[i_2] != value) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = long]";
      *(undefined4 *)(puVar4 + 1) = 0x16;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  for (; 3 < local_2bc; local_2bc = local_2bc + -4) {
    local_160 = local_2b8;
    local_60 = local_2b0;
    local_28 = local_2b0;
    local_248 = *local_2b0;
    eStack_240 = local_2b0[1];
    local_140 = local_2b8;
    *local_2b8 = local_248;
    local_2b8[1] = eStack_240;
    local_180 = local_2b8 + 2;
    local_68 = local_2b0 + 2;
    local_258 = *local_68;
    eStack_250 = local_2b0[3];
    *local_180 = local_258;
    local_2b8[3] = eStack_250;
    local_1a0 = local_2b8 + 4;
    local_70 = local_2b0 + 4;
    local_268 = *local_70;
    eStack_260 = local_2b0[5];
    *local_1a0 = local_268;
    local_2b8[5] = eStack_260;
    local_1c0 = local_2b8 + 6;
    local_78 = local_2b0 + 6;
    local_278 = *local_78;
    eStack_270 = local_2b0[7];
    *local_1c0 = local_278;
    local_2b8[7] = eStack_270;
    local_2b8 = local_2b8 + 8;
    local_2b0 = local_2b0 + 8;
    local_1d8 = local_278;
    eStack_1d0 = eStack_270;
    local_1b8 = local_268;
    eStack_1b0 = eStack_260;
    local_198 = local_258;
    eStack_190 = eStack_250;
    local_178 = local_248;
    eStack_170 = eStack_240;
    local_158 = local_248;
    eStack_150 = eStack_240;
    local_138 = local_258;
    eStack_130 = eStack_250;
    local_120 = local_180;
    local_118 = local_268;
    eStack_110 = eStack_260;
    local_100 = local_1a0;
    local_f8 = local_278;
    eStack_f0 = eStack_270;
    local_e0 = local_1c0;
    local_20 = local_68;
    local_18 = local_70;
    local_10 = local_78;
  }
  if (1 < local_2bc) {
    local_50 = local_2b0;
    local_38 = local_2b0;
    local_288 = *local_2b0;
    eStack_280 = local_2b0[1];
    local_1e0 = local_2b8;
    local_c0 = local_2b8;
    *local_2b8 = local_288;
    local_2b8[1] = eStack_280;
    local_200 = local_2b8 + 2;
    local_58 = local_2b0 + 2;
    local_298 = *local_58;
    eStack_290 = local_2b0[3];
    *local_200 = local_298;
    local_2b8[3] = eStack_290;
    local_2bc = local_2bc + -2;
    local_2b0 = local_2b0 + 4;
    local_2b8 = local_2b8 + 4;
    local_218 = local_298;
    eStack_210 = eStack_290;
    local_1f8 = local_288;
    eStack_1f0 = eStack_280;
    local_d8 = local_288;
    eStack_d0 = eStack_280;
    local_b8 = local_298;
    eStack_b0 = eStack_290;
    local_a0 = local_200;
    local_30 = local_58;
  }
  if (local_2bc != 0) {
    local_48 = local_2b0;
    local_40 = local_2b0;
    local_2a8 = *local_2b0;
    eStack_2a0 = local_2b0[1];
    local_220 = local_2b8;
    local_80 = local_2b8;
    *local_2b8 = local_2a8;
    local_2b8[1] = eStack_2a0;
    local_238 = local_2a8;
    eStack_230 = eStack_2a0;
    local_98 = local_2a8;
    eStack_90 = eStack_2a0;
  }
  if (length != 0) {
    local_5a0[(int)(length - 1)] = peVar3[(int)(length - 1)];
  }
  for (i_3 = 0; local_2d4 = length, local_2d0 = local_5a0, local_2c8 = peVar3, i_3 < length;
      i_3 = i_3 + 1) {
    if (local_5a0[i_3] != value) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = long]";
      *(undefined4 *)(puVar4 + 1) = 0x1d;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<long>(local_5a0,length);
  for (i_4 = 0; i_4 < length; i_4 = i_4 + 1) {
    if (local_5a0[i_4] != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = long]";
      *(undefined4 *)(puVar4 + 1) = 0x24;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  for (local_898 = 0; local_58c = iVar1, local_588 = local_5a0, local_580 = peVar3,
      local_898 < length; local_898 = local_898 + 1) {
    peVar3[local_898] = (ulong)local_898;
  }
  for (; 3 < local_58c; local_58c = local_58c + -4) {
    local_430 = local_588;
    local_330 = local_580;
    local_2f8 = local_580;
    local_518 = *local_580;
    eStack_510 = local_580[1];
    local_410 = local_588;
    *local_588 = local_518;
    local_588[1] = eStack_510;
    local_450 = local_588 + 2;
    local_338 = local_580 + 2;
    local_528 = *local_338;
    eStack_520 = local_580[3];
    *local_450 = local_528;
    local_588[3] = eStack_520;
    local_470 = local_588 + 4;
    local_340 = local_580 + 4;
    local_538 = *local_340;
    eStack_530 = local_580[5];
    *local_470 = local_538;
    local_588[5] = eStack_530;
    local_490 = local_588 + 6;
    local_348 = local_580 + 6;
    local_548 = *local_348;
    eStack_540 = local_580[7];
    *local_490 = local_548;
    local_588[7] = eStack_540;
    local_588 = local_588 + 8;
    local_580 = local_580 + 8;
    local_4a8 = local_548;
    eStack_4a0 = eStack_540;
    local_488 = local_538;
    eStack_480 = eStack_530;
    local_468 = local_528;
    eStack_460 = eStack_520;
    local_448 = local_518;
    eStack_440 = eStack_510;
    local_428 = local_518;
    eStack_420 = eStack_510;
    local_408 = local_528;
    eStack_400 = eStack_520;
    local_3f0 = local_450;
    local_3e8 = local_538;
    eStack_3e0 = eStack_530;
    local_3d0 = local_470;
    local_3c8 = local_548;
    eStack_3c0 = eStack_540;
    local_3b0 = local_490;
    local_2f0 = local_338;
    local_2e8 = local_340;
    local_2e0 = local_348;
  }
  if (1 < local_58c) {
    local_320 = local_580;
    local_308 = local_580;
    local_558 = *local_580;
    eStack_550 = local_580[1];
    local_4b0 = local_588;
    local_390 = local_588;
    *local_588 = local_558;
    local_588[1] = eStack_550;
    local_4d0 = local_588 + 2;
    local_328 = local_580 + 2;
    local_568 = *local_328;
    eStack_560 = local_580[3];
    *local_4d0 = local_568;
    local_588[3] = eStack_560;
    local_58c = local_58c + -2;
    local_580 = local_580 + 4;
    local_588 = local_588 + 4;
    local_4e8 = local_568;
    eStack_4e0 = eStack_560;
    local_4c8 = local_558;
    eStack_4c0 = eStack_550;
    local_3a8 = local_558;
    eStack_3a0 = eStack_550;
    local_388 = local_568;
    eStack_380 = eStack_560;
    local_370 = local_4d0;
    local_300 = local_328;
  }
  if (local_58c != 0) {
    local_318 = local_580;
    local_310 = local_580;
    local_578 = *local_580;
    eStack_570 = local_580[1];
    local_4f0 = local_588;
    local_350 = local_588;
    *local_588 = local_578;
    local_588[1] = eStack_570;
    local_508 = local_578;
    eStack_500 = eStack_570;
    local_368 = local_578;
    eStack_360 = eStack_570;
  }
  if (length != 0) {
    local_5a0[(int)(length - 1)] = peVar3[(int)(length - 1)];
  }
  for (local_89c = 0; local_5a4 = length, local_598 = peVar3, local_89c < length;
      local_89c = local_89c + 1) {
    if (local_5a0[local_89c] != (ulong)local_89c) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = long]";
      *(undefined4 *)(puVar4 + 1) = 0x2d;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  if ((peVar3[length] == 0x7f) && (local_5a0[length] == 0x3f)) {
    std::shared_ptr<long>::~shared_ptr((shared_ptr<long> *)local_868);
    std::shared_ptr<long>::~shared_ptr
              ((shared_ptr<long> *)
               &pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = "void test_common(unsigned int, T) [T = long]";
  *(undefined4 *)(puVar4 + 1) = 0x31;
  *(uint *)((long)puVar4 + 0xc) = length;
  __cxa_throw(puVar4,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}